

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O0

void ntheader(fnhead *fnobj)

{
  LispPTR LVar1;
  int local_2c;
  LispPTR fnobj_lisp;
  int localntsize;
  LispPTR *localnt1;
  fnhead *fnobj_local;
  
  LVar1 = LAddrFromNative(fnobj);
  printf("0x%08x: 0x%08x  stkmin\n",(ulong)LVar1,(ulong)fnobj->stkmin);
  printf("0x%08x: 0x%08x  na\n",(ulong)(LVar1 + 1),(ulong)(uint)(int)fnobj->na);
  printf("0x%08x: 0x%08x  pv\n",(ulong)(LVar1 + 2),(ulong)(uint)(int)fnobj->pv);
  printf("0x%08x: 0x%08x  startpc\n",(ulong)(LVar1 + 3),(ulong)fnobj->startpc);
  printf("0x%08x: 0x%08x  argtype\n",(ulong)(LVar1 + 4),
         (ulong)(*(uint *)&fnobj->field_0x8 >> 0x1c & 3));
  printf("0x%08x: 0x%08x  framename ",(ulong)(LVar1 + 5),
         (ulong)(*(uint *)&fnobj->field_0x8 & 0xfffffff));
  print(*(uint *)&fnobj->field_0x8 & 0xfffffff);
  putchar(10);
  printf("0x%08x: 0x%08x  ntsize\n",(ulong)(LVar1 + 6),(ulong)fnobj->ntsize);
  printf("0x%08x: 0x%08x  nlocals",(ulong)(LVar1 + 7),(ulong)(*(ushort *)&fnobj->field_0xc >> 8));
  printf("  0x%08x  fvaroffset\n",(ulong)(*(ushort *)&fnobj->field_0xc & 0xff));
  nt1((LispPTR *)(fnobj + 1),(uint)fnobj->ntsize,"Name Table");
  if (fnobj->ntsize == 0) {
    local_2c = 4;
  }
  else {
    local_2c = (uint)fnobj->ntsize << 1;
  }
  nt1((LispPTR *)(&fnobj[1].na + local_2c),
      (int)((long)fnobj +
            ((long)((int)(uint)fnobj->startpc >> 1) * 2 - (long)(&fnobj[1].na + local_2c)) >> 2),
      "Local args");
  return;
}

Assistant:

void ntheader(struct fnhead *fnobj) {
  LispPTR *localnt1;
  int localntsize;
  LispPTR fnobj_lisp;

  fnobj_lisp = LAddrFromNative((DLword *)fnobj);
  printf("0x%08x: 0x%08x  stkmin\n", fnobj_lisp, fnobj->stkmin);
  printf("0x%08x: 0x%08x  na\n", fnobj_lisp + 1, fnobj->na);
  printf("0x%08x: 0x%08x  pv\n", fnobj_lisp + 2, fnobj->pv);
  printf("0x%08x: 0x%08x  startpc\n", fnobj_lisp + 3, fnobj->startpc);
  printf("0x%08x: 0x%08x  argtype\n", fnobj_lisp + 4, fnobj->argtype);
  printf("0x%08x: 0x%08x  framename ", fnobj_lisp + 5, fnobj->framename);
  print(fnobj->framename);
  putchar('\n');
  printf("0x%08x: 0x%08x  ntsize\n", fnobj_lisp + 6, fnobj->ntsize);
  printf("0x%08x: 0x%08x  nlocals", fnobj_lisp + 7, fnobj->nlocals);
  printf("  0x%08x  fvaroffset\n", fnobj->fvaroffset);

  nt1((LispPTR *)((DLword *)fnobj + FNOVERHEADWORDS), fnobj->ntsize, "Name Table");
  localnt1 =
      (LispPTR *)((DLword *)fnobj + FNOVERHEADWORDS + (fnobj->ntsize ? (2 * fnobj->ntsize) : 4));
  localntsize = ((DLword *)fnobj + (fnobj->startpc >> 1) - (DLword *)localnt1) >> 1;
  nt1(localnt1, localntsize, "Local args");
}